

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  
  pcVar1 = ptr + 2;
  do {
    if (pcVar1 == end + -2) {
      return 1;
    }
    if (*pcVar1 != '\0') goto LAB_00159c2f;
    uVar3 = (ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar1[1]);
    if (uVar3 < 0x24) {
      if ((0xfcb8fe600U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x4400000UL >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 != 0x15) goto LAB_00159c1b;
          if (pcVar1[1] == '\t') goto LAB_00159c2f;
        }
        else {
          cVar2 = pcVar1[1];
          if (cVar2 < '\0') goto LAB_00159c1f;
        }
      }
    }
    else {
LAB_00159c1b:
      cVar2 = pcVar1[1];
LAB_00159c1f:
      if ((cVar2 != '$') && (cVar2 != '@')) {
LAB_00159c2f:
        *badPtr = pcVar1;
        return 0;
      }
    }
    pcVar1 = pcVar1 + 2;
  } while( true );
}

Assistant:

static
int PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **badPtr)
{
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; ptr != end; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#ifdef XML_NS
    case BT_COLON:
#endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (!(BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}